

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

uint16_t parse_ncname(ly_ctx *ctx,char *ncname)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint local_2c [2];
  uint size;
  
  uVar1 = lyxml_getutf8(ctx,ncname,local_2c);
  if (((uVar1 != 0x5f && 0x19 < uVar1 - 0x61) && (uVar1 != 0x3a && 0x19 < uVar1 - 0x41)) &&
     (uVar1 == 0x37e || 0x1c8f < uVar1 - 0x370)) {
    if ((((0x20d < uVar1 - 0xfdf0) && (0x4cf < uVar1 - 0xf900)) &&
        ((0xa7fe < uVar1 - 0x3001 && ((0x3ef < uVar1 - 0x2c00 && (0x11f < uVar1 - 0x2070)))))) &&
       (((uVar1 & 0xfffffffe) != 0x200c && (0x23f < uVar1 - 0xc0 || (uVar1 & 0xffffffdf) == 0xd7))))
    {
      if (uVar1 - 0xf0000 < 0xfff20000) {
        return 0;
      }
      goto LAB_001758c7;
    }
  }
  if (uVar1 == 0x3a) {
    return 0;
  }
LAB_001758c7:
  uVar3 = (ulong)(local_2c[0] & 0xffff);
  if (ncname[uVar3] == '\0') {
    return (uint16_t)local_2c[0];
  }
  uVar1 = local_2c[0];
  do {
    uVar2 = lyxml_getutf8(ctx,ncname + uVar3,local_2c);
    if (uVar2 - 0x61 < 0x1a) {
LAB_001758f3:
      if (uVar2 == 0x3a) {
        return (uint16_t)uVar1;
      }
    }
    else if ((uVar2 != 0x2d) && (uVar2 != 0x5f)) {
      if (10 < uVar2 - 0x30 && 0x19 < uVar2 - 0x41) {
        if ((uVar2 == 0x2e) || (uVar2 == 0xb7)) goto LAB_00175907;
        if (uVar2 == 0x37e || 0x1c8f < uVar2 - 0x370) {
          if (((((0x20d < uVar2 - 0xfdf0) && (0x4cf < uVar2 - 0xf900)) && (0xa7fe < uVar2 - 0x3001))
              && ((0x3ef < uVar2 - 0x2c00 && (0x11f < uVar2 - 0x2070)))) &&
             ((0x6f < uVar2 - 0x300 &&
              (((uVar2 & 0xfffffffe) != 0x200c &&
               (0x23f < uVar2 - 0xc0 || (uVar2 & 0xffffffdf) == 0xd7)))))) {
            if (0xdffff < uVar2 - 0x10000) {
              return (uint16_t)uVar1;
            }
            goto LAB_00175907;
          }
        }
      }
      goto LAB_001758f3;
    }
LAB_00175907:
    uVar1 = uVar1 + local_2c[0];
    uVar3 = (ulong)(uVar1 & 0xffff);
    if (ncname[uVar3] == '\0') {
      return (uint16_t)uVar1;
    }
  } while( true );
}

Assistant:

static uint16_t
parse_ncname(struct ly_ctx *ctx, const char *ncname)
{
    uint16_t parsed = 0;
    int uc;
    unsigned int size;

    uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    if (!is_xmlnamestartchar(uc) || (uc == ':')) {
       return parsed;
    }

    do {
        parsed += size;
        if (!ncname[parsed]) {
            break;
        }
        uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    } while (is_xmlnamechar(uc) && (uc != ':'));

    return parsed;
}